

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManPrintTents(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  uint local_38;
  int nPis;
  int nSizeCurr;
  int nSizePrev;
  int iObjId;
  int i;
  int t;
  Gia_Obj_t *pObj;
  Vec_Int_t *vObjs;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManPoNum(p);
  if (iVar1 < 1) {
    __assert_fail("Gia_ManPoNum(p) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaMan.c"
                  ,0x120,"void Gia_ManPrintTents(Gia_Man_t *)");
  }
  p_00 = Vec_IntAlloc(100);
  Gia_ManIncrementTravId(p);
  pGVar4 = Gia_ManConst0(p);
  Gia_ObjSetTravIdCurrent(p,pGVar4);
  Vec_IntPush(p_00,0);
  nPis = Vec_IntSize(p_00);
  nSizePrev = 0;
  while( true ) {
    iVar1 = Gia_ManPoNum(p);
    bVar5 = false;
    if (nSizePrev < iVar1) {
      _i = Gia_ManCo(p,nSizePrev);
      bVar5 = _i != (Gia_Obj_t *)0x0;
    }
    if (!bVar5) break;
    Gia_ManPrintTents_rec(p,_i,p_00);
    nSizePrev = nSizePrev + 1;
  }
  Abc_Print(1,"Tents:  ");
  iObjId = 1;
  while (iVar1 = Vec_IntSize(p_00), nPis < iVar1) {
    local_38 = 0;
    iVar1 = Vec_IntSize(p_00);
    for (nSizePrev = nPis; nSizePrev < iVar1; nSizePrev = nSizePrev + 1) {
      iVar2 = Vec_IntEntry(p_00,nSizePrev);
      pGVar4 = Gia_ManObj(p,iVar2);
      iVar3 = Gia_ObjIsPi(p,pGVar4);
      local_38 = iVar3 + local_38;
      pGVar4 = Gia_ManObj(p,iVar2);
      iVar3 = Gia_ObjIsRo(p,pGVar4);
      if (iVar3 != 0) {
        pGVar4 = Gia_ManObj(p,iVar2);
        pGVar4 = Gia_ObjRoToRi(p,pGVar4);
        Gia_ManPrintTents_rec(p,pGVar4,p_00);
      }
    }
    Abc_Print(1,"%d=%d(%d)  ",(ulong)(uint)iObjId,(ulong)(uint)(iVar1 - nPis),(ulong)local_38);
    iObjId = iObjId + 1;
    nPis = iVar1;
  }
  iVar1 = Gia_ManObjNum(p);
  iVar2 = Vec_IntSize(p_00);
  Abc_Print(1," Unused=%d\n",(ulong)(uint)(iVar1 - iVar2));
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Gia_ManPrintTents( Gia_Man_t * p )
{
    Vec_Int_t * vObjs;
    Gia_Obj_t * pObj;
    int t, i, iObjId, nSizePrev, nSizeCurr;
    assert( Gia_ManPoNum(p) > 0 );
    vObjs = Vec_IntAlloc( 100 );
    // save constant class
    Gia_ManIncrementTravId( p );
    Gia_ObjSetTravIdCurrent( p, Gia_ManConst0(p) );
    Vec_IntPush( vObjs, 0 );
    // create starting root
    nSizePrev = Vec_IntSize(vObjs);
    Gia_ManForEachPo( p, pObj, i )
        Gia_ManPrintTents_rec( p, pObj, vObjs );
    // build tents
    Abc_Print( 1, "Tents:  " );
    for ( t = 1; nSizePrev < Vec_IntSize(vObjs); t++ )
    {
        int nPis = 0;
        nSizeCurr = Vec_IntSize(vObjs);
        Vec_IntForEachEntryStartStop( vObjs, iObjId, i, nSizePrev, nSizeCurr )
        {
            nPis += Gia_ObjIsPi(p, Gia_ManObj(p, iObjId));
            if ( Gia_ObjIsRo(p, Gia_ManObj(p, iObjId)) )
                Gia_ManPrintTents_rec( p, Gia_ObjRoToRi(p, Gia_ManObj(p, iObjId)), vObjs );
        }
        Abc_Print( 1, "%d=%d(%d)  ", t, nSizeCurr - nSizePrev, nPis );
        nSizePrev = nSizeCurr;
    }
    Abc_Print( 1, " Unused=%d\n", Gia_ManObjNum(p) - Vec_IntSize(vObjs) );
    Vec_IntFree( vObjs );
    // the remaining objects are PIs without fanout
//    Gia_ManForEachObj( p, pObj, i )
//        if ( !Gia_ObjIsTravIdCurrent(p, pObj) )
//            Gia_ObjPrint( p, pObj );
}